

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

void vkt::wsi::anon_unknown_0::populateRenderGroup(TestCaseGroup *testGroup,Type wsiType)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"basic",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Basic Rendering Test",&local_52);
  addFunctionCaseWithPrograms<vk::wsi::Type>
            (testGroup,&local_30,&local_50,getBasicRenderPrograms,basicRenderTest,wsiType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void populateRenderGroup (tcu::TestCaseGroup* testGroup, Type wsiType)
{
	addFunctionCaseWithPrograms(testGroup, "basic", "Basic Rendering Test", getBasicRenderPrograms, basicRenderTest, wsiType);
}